

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

void __thiscall HttpSession::HttpSession(HttpSession *this,socket *socket)

{
  node_ptr prVar1;
  list_t *plVar2;
  integral_constant<bool,_false> local_11;
  
  (this->super_enable_shared_from_this<HttpSession>)._M_weak_this.
  super___weak_ptr<HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<HttpSession>)._M_weak_this.
  super___weak_ptr<HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::
  make_shared<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>::impl_type,std::integral_constant<bool,false>,boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
            ((boost *)&this->stream,&local_11,socket);
  (this->buffer).out_ = (char *)0x0;
  (this->buffer).last_ = (char *)0x0;
  (this->buffer).begin_ = (char *)0x0;
  (this->buffer).in_ = (char *)0x0;
  (this->buffer).end_ = (char *)0x0;
  (this->buffer).max_ = 0xffffffffffffffff;
  prVar1 = (node_ptr)
           ((long)&(this->req).
                   super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                   super_basic_fields<std::allocator<char>_>.set_.
                   super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           + 8);
  (((bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
     *)((long)&(this->req).
               super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
               super_basic_fields<std::allocator<char>_>.set_.
               super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
               .
               super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
               .
               super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       + 8))->
  super_bstbase3<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  ).holder.root.super_node.parent_ = (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x18) = (node_ptr)0x0;
  *(undefined8 *)
   ((long)&(this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x20) = 0;
  *(node_ptr *)
   ((long)&(this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = prVar1;
  *(node_ptr *)
   ((long)&(this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x18) = prVar1;
  *(color *)((long)&(this->req).
                    super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                    super_basic_fields<std::allocator<char>_>.set_.
                    super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            + 0x20) = red_t;
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void> = 0;
  plVar2 = &(this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>
            .super_basic_fields<std::allocator<char>_>.list_;
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header + 8) =
       (node_ptr)0x0;
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)plVar2;
  *(list_t **)
   ((long)&(this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header + 8) =
       plVar2;
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.method_._M_len = 0;
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.method_._M_str = (char *)0x0;
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.target_or_reason_._M_len = 0;
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.target_or_reason_._M_str = (char *)0x0;
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.version_
       = 0xb;
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.method_ =
       unknown;
  (this->req).
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_._M_dataplus._M_p =
       (pointer)&(this->req).
                 super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                 .value_.field_2;
  (this->req).
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_._M_string_length = 0;
  (this->req).
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_.field_2._M_local_buf[0] = '\0';
  (this->res).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->res).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lambda).self_ref = this;
  return;
}

Assistant:

explicit HttpSession(tcp::socket&& socket): stream(std::move(socket)), lambda(*this) {}